

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O2

void Cmd_linetarget(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  DAngle *angle;
  char *pcVar2;
  DAngle DVar3;
  bool bVar4;
  uint uVar5;
  PClass *pPVar6;
  undefined1 local_40 [24];
  FTranslatedLineTarget t;
  
  bVar4 = CheckCheatmode(true);
  if ((!bVar4) && (angle = (DAngle *)(&players)[(long)consoleplayer * 0x54], angle != (DAngle *)0x0)
     ) {
    local_40._16_8_ = angle[0x12].Degrees;
    local_40._8_8_ = (PClass *)0x0;
    DVar3 = P_AimLineAttack((AActor *)local_40,angle,2048.0,
                            (FTranslatedLineTarget *)(local_40 + 0x10),(DAngle *)&t,
                            (int)local_40 + 8,(AActor *)0x0,(AActor *)0x0);
    if (t.linetarget == (AActor *)0x0) {
      Printf("No target found\n",SUB84(DVar3.Degrees,0));
    }
    else {
      pPVar6 = DObject::GetClass((DObject *)t.linetarget);
      pcVar2 = FName::NameData.NameArray[(pPVar6->super_PStruct).super_PNamedType.TypeName.Index].
               Text;
      uVar1 = (t.linetarget)->health;
      uVar5 = AActor::SpawnHealth(t.linetarget);
      Printf("Target=%s, Health=%d, Spawnhealth=%d\n",pcVar2,(ulong)uVar1,(ulong)uVar5);
    }
  }
  return;
}

Assistant:

CCMD(linetarget)
{
	FTranslatedLineTarget t;

	if (CheckCheatmode () || players[consoleplayer].mo == NULL) return;
	P_AimLineAttack(players[consoleplayer].mo,players[consoleplayer].mo->Angles.Yaw, MISSILERANGE, &t, 0.);
	if (t.linetarget)
	{
		Printf("Target=%s, Health=%d, Spawnhealth=%d\n",
			t.linetarget->GetClass()->TypeName.GetChars(),
			t.linetarget->health,
			t.linetarget->SpawnHealth());
	}
	else Printf("No target found\n");
}